

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void xmlUnlinkNode(xmlNodePtr cur)

{
  xmlElementType xVar1;
  _xmlDoc *p_Var2;
  
  if ((cur != (xmlNodePtr)0x0) && (xVar1 = cur->type, xVar1 != XML_NAMESPACE_DECL)) {
    if (xVar1 == XML_ENTITY_DECL) {
      xmlRemoveEntity((xmlEntityPtr)cur);
    }
    else if ((xVar1 == XML_DTD_NODE) && (p_Var2 = cur->doc, p_Var2 != (_xmlDoc *)0x0)) {
      if (p_Var2->intSubset == (_xmlDtd *)cur) {
        p_Var2->intSubset = (_xmlDtd *)0x0;
      }
      if (p_Var2->extSubset == (_xmlDtd *)cur) {
        p_Var2->extSubset = (_xmlDtd *)0x0;
      }
    }
    xmlUnlinkNodeInternal(cur);
    return;
  }
  return;
}

Assistant:

void
xmlUnlinkNode(xmlNodePtr cur) {
    if (cur == NULL)
	return;

    if (cur->type == XML_NAMESPACE_DECL)
        return;

    if (cur->type == XML_DTD_NODE) {
	xmlDocPtr doc = cur->doc;

	if (doc != NULL) {
	    if (doc->intSubset == (xmlDtdPtr) cur)
		doc->intSubset = NULL;
	    if (doc->extSubset == (xmlDtdPtr) cur)
		doc->extSubset = NULL;
	}
    }

    if (cur->type == XML_ENTITY_DECL)
        xmlRemoveEntity((xmlEntityPtr) cur);

    xmlUnlinkNodeInternal(cur);
}